

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,int flags)

{
  string_view str_00;
  bool bVar1;
  string_view in;
  allocator<char> local_39;
  cmOutputConverter *local_38;
  char *local_30;
  undefined4 local_24;
  undefined1 auStack_20 [4];
  int flags_local;
  string_view str_local;
  
  local_30 = (char *)str._M_len;
  local_24 = str._M_str._0_4_;
  str_00._M_str = local_30;
  str_00._M_len = (size_t)this;
  local_38 = this;
  _auStack_20 = this;
  str_local._M_len = (size_t)local_30;
  str_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = cmOutputConverterIsShellOperator(str_00);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_20,&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    in._M_str._0_4_ = local_24;
    in._M_len = str_local._M_len;
    in._M_str._4_4_ = 0;
    Shell_GetArgument_abi_cxx11_(__return_storage_ptr__,_auStack_20,in,flags);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str, int flags)
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return std::string(str);
  }

  return Shell_GetArgument(str, flags);
}